

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

PixelBufferAccess *
tcu::getSubregion(PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *access,int x,int y,
                 int z,int width,int height,int depth)

{
  IVec3 local_14;
  
  local_14.m_data[1] = height;
  local_14.m_data[2] = depth;
  local_14.m_data[0] = width;
  PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)access,&local_14,
             &(access->super_ConstPixelBufferAccess).m_pitch,
             (void *)((long)(access->super_ConstPixelBufferAccess).m_data +
                     (long)(z * (access->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
                     (long)(y * (access->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                     (long)(x * (access->super_ConstPixelBufferAccess).m_pitch.m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess getSubregion (const PixelBufferAccess& access, int x, int y, int z, int width, int height, int depth)
{
	DE_ASSERT(de::inBounds(x, 0, access.getWidth()));
	DE_ASSERT(de::inRange(x+width, x+1, access.getWidth()));

	DE_ASSERT(de::inBounds(y, 0, access.getHeight()));
	DE_ASSERT(de::inRange(y+height, y+1, access.getHeight()));

	DE_ASSERT(de::inBounds(z, 0, access.getDepth()));
	DE_ASSERT(de::inRange(z+depth, z+1, access.getDepth()));

	return PixelBufferAccess(access.getFormat(), tcu::IVec3(width, height, depth), access.getPitch(),
							 (deUint8*)access.getDataPtr() + access.getPixelPitch()*x + access.getRowPitch()*y + access.getSlicePitch()*z);
}